

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.cpp
# Opt level: O2

void __thiscall
xmrig::WriteBaton::WriteBaton
          (WriteBaton *this,stringstream *ss,char *data,size_t size,HttpContext *ctx)

{
  size_type sVar1;
  char *__dest;
  
  (this->super_Baton<uv_write_s>).req.data = this;
  this->m_ctx = ctx;
  std::__cxx11::stringbuf::str();
  sVar1 = (this->m_header)._M_string_length;
  this->bufs[0].base = (this->m_header)._M_dataplus._M_p;
  this->bufs[0].len = sVar1;
  if (data != (char *)0x0) {
    this->bufs[1].len = size;
    __dest = (char *)operator_new__(size);
    this->bufs[1].base = __dest;
    memcpy(__dest,data,size);
    return;
  }
  this->bufs[1].base = (char *)0x0;
  this->bufs[1].len = 0;
  return;
}

Assistant:

inline WriteBaton(const std::stringstream &ss, const char *data, size_t size, HttpContext *ctx) :
        m_ctx(ctx),
        m_header(ss.str())
    {
        bufs[0].len  = m_header.size();
        bufs[0].base = const_cast<char *>(m_header.c_str());

        if (data) {
            bufs[1].len  = size;
            bufs[1].base = new char[size];
            memcpy(bufs[1].base, data, size);
        }
        else {
            bufs[1].base = nullptr;
            bufs[1].len  = 0;
        }
    }